

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBufferOperationsViaTransformFeedback::getTFFragmentShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperationsViaTransformFeedback *this)

{
  stringstream local_1a0 [8];
  stringstream strstream;
  ostream local_190;
  TextureBufferOperationsViaTransformFeedback *local_18;
  TextureBufferOperationsViaTransformFeedback *this_local;
  
  local_18 = this;
  this_local = (TextureBufferOperationsViaTransformFeedback *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nin flat ivec4 outPosition;\n\nprecision highp float;\n\nvoid main(void)\n{\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperationsViaTransformFeedback::getTFFragmentShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "${TEXTURE_BUFFER_REQUIRE}\n"
				 "\n"
				 "in flat ivec4 outPosition;\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "}\n";

	return strstream.str();
}